

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Imputer::clear_ImputedValue(Imputer *this)

{
  StringToDoubleMap *pSVar1;
  _func_int **pp_Var2;
  
  switch(this->_oneof_case_[0]) {
  case 3:
    pSVar1 = (this->ImputedValue_).imputedstringdictionary_;
    if (pSVar1 != (StringToDoubleMap *)
                  &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      if (pSVar1 != (StringToDoubleMap *)0x0) {
        pp_Var2 = (pSVar1->super_MessageLite)._vptr_MessageLite;
        if ((MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
             *)pp_Var2 != &pSVar1->map_) {
          operator_delete(pp_Var2,(ulong)((pSVar1->map_).arena_ + 1));
        }
      }
      operator_delete(pSVar1,0x20);
    }
    break;
  case 4:
  case 5:
  case 6:
  case 7:
    if ((this->ImputedValue_).imputeddoublearray_ != (DoubleVector *)0x0) {
      (*(((this->ImputedValue_).imputeddoublearray_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Imputer::clear_ImputedValue() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Imputer)
  switch (ImputedValue_case()) {
    case kImputedDoubleValue: {
      // No need to clear
      break;
    }
    case kImputedInt64Value: {
      // No need to clear
      break;
    }
    case kImputedStringValue: {
      ImputedValue_.imputedstringvalue_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case kImputedDoubleArray: {
      delete ImputedValue_.imputeddoublearray_;
      break;
    }
    case kImputedInt64Array: {
      delete ImputedValue_.imputedint64array_;
      break;
    }
    case kImputedStringDictionary: {
      delete ImputedValue_.imputedstringdictionary_;
      break;
    }
    case kImputedInt64Dictionary: {
      delete ImputedValue_.imputedint64dictionary_;
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = IMPUTEDVALUE_NOT_SET;
}